

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.cpp
# Opt level: O2

void __thiscall
Js::PrototypeChainCache<Js::NoSpecialPropertyCache>::Register
          (PrototypeChainCache<Js::NoSpecialPropertyCache> *this,Type *type)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  ScriptContext *pSVar5;
  ScriptContext *pSVar6;
  Type *local_28;
  Type *type_local;
  
  local_28 = type;
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/PrototypeChainCache.cpp"
                                ,0x86,"(type)","type");
    if (!bVar2) goto LAB_009e08a1;
    *puVar4 = 0;
  }
  pSVar5 = Js::Type::GetScriptContext(type);
  pSVar6 = ((this->scriptRegistry).ptr)->scriptContext;
  if (pSVar5 != pSVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/PrototypeChainCache.cpp"
                                ,0x87,
                                "(type->GetScriptContext() == scriptRegistry->GetScriptContext())",
                                "type->GetScriptContext() == scriptRegistry->GetScriptContext()");
    if (!bVar2) goto LAB_009e08a1;
    *puVar4 = 0;
    pSVar6 = ((this->scriptRegistry).ptr)->scriptContext;
  }
  iVar3 = (*(pSVar6->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
  if ((char)iVar3 != '\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/PrototypeChainCache.cpp"
                                ,0x88,"(!scriptRegistry->GetScriptContext()->IsClosed())",
                                "!scriptRegistry->GetScriptContext()->IsClosed()");
    if (!bVar2) {
LAB_009e08a1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  NoSpecialPropertyCache::RegistrationAssert(type);
  if ((this->types).super_ReadOnlyList<Js::Type_*,_Memory::Recycler,_DefaultComparer>.count == 0) {
    ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::Register
              ((this->scriptRegistry).ptr);
  }
  JsUtil::List<Js::Type_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
            (&this->types,&local_28);
  return;
}

Assistant:

void
PrototypeChainCache<T>::Register(_In_ Type* type)
{
    Assert(type);
    Assert(type->GetScriptContext() == scriptRegistry->GetScriptContext());
    Assert(!scriptRegistry->GetScriptContext()->IsClosed());
#if DBG
    T::RegistrationAssert(type);
#endif

    if (this->types.Count() == 0)
    {
        this->scriptRegistry->Register();
    }
    this->types.Add(type);
}